

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O3

void __thiscall Code_generator::visit(Code_generator *this,Dir_align *s)

{
  Value_type VVar1;
  Expression *pEVar2;
  int iVar3;
  string local_38;
  
  iVar3 = (*s->size->_vptr_Expression[3])();
  if ((char)iVar3 != '\0') {
    pEVar2 = s->size;
    VVar1 = pEVar2->type;
    if (VVar1 == LABEL) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"Can\'t be a label, must be a constant","");
      error_report(&pEVar2->location,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
    else if (VVar1 == ABSOLUTE) {
      ast::Sections::fill((s->super_Directive).super_Statement.section_index,
                          (s->super_Directive).super_Statement.section_offset,'\0',
                          (s->super_Directive).super_Statement.size_in_memory);
      return;
    }
  }
  return;
}

Assistant:

void Code_generator::visit(Dir_align *s)
{
	if (s->size->evaluate()) {
		auto size_value = s->size->get_value();
		auto size_type = s->size->get_type();
		if (size_type == ABSOLUTE) {
			if (size_value < 0 && size_value > 1)
				warning_report(&s->size->location, "Invalid value for alignment. Must be 1 or 0");
			Sections::fill(s->section_index, s->section_offset, 0, s->size_in_memory);
		}
		else if (size_type == Value_type::LABEL)
			error_report(&s->size->location,"Can't be a label, must be a constant");
	}
}